

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_pthreads_threading.h
# Opt level: O0

bool __thiscall
lzham::task_pool::
queue_multiple_object_tasks<lzham::lzcompressor,void(lzham::lzcompressor::*)(unsigned_long_long,void*)>
          (task_pool *this,lzcompressor *pObject,offset_in_lzcompressor_to_subr pObject_method,
          uint64 first_data,uint num_tasks,void *pData_ptr)

{
  bool bVar1;
  long in_RDI;
  long in_R8;
  uint in_R9D;
  object_task_flags *in_stack_00000008;
  task tsk;
  uint i;
  bool status;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  tsstack<lzham::task_pool::task,_16U> *in_stack_ffffffffffffff90;
  object_task_flags *in_stack_ffffffffffffff98;
  anon_union_8_2_408cf123_for_task_2 in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  uint local_4c;
  bool local_1;
  
  if (in_R9D == 0) {
    local_1 = true;
  }
  else {
    local_1 = true;
    for (local_4c = 0; local_4c < in_R9D; local_4c = local_4c + 1) {
      task::task((task *)&stack0xffffffffffffff90);
      in_stack_ffffffffffffff8c = 1;
      in_stack_ffffffffffffffa0.m_callback =
           (task_callback_func)
           lzham_new<lzham::object_task<lzham::lzcompressor>,lzham::lzcompressor*,void(lzham::lzcompressor::*)(unsigned_long_long,void*),lzham::object_task_flags>
                     ((lzcompressor **)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
                      ,in_stack_ffffffffffffffa0.m_callback,in_stack_ffffffffffffff98);
      if ((object_task<lzham::lzcompressor> *)in_stack_ffffffffffffffa0.m_callback ==
          (object_task<lzham::lzcompressor> *)0x0) {
        local_1 = false;
        break;
      }
      in_stack_ffffffffffffff90 = (tsstack<lzham::task_pool::task,_16U> *)(in_R8 + (ulong)local_4c);
      in_stack_ffffffffffffffa8 = 1;
      in_stack_ffffffffffffff98 = in_stack_00000008;
      bVar1 = tsstack<lzham::task_pool::task,_16U>::try_push
                        (in_stack_ffffffffffffff90,
                         (task *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      if (!bVar1) {
        local_1 = false;
        break;
      }
    }
    if (local_4c != 0) {
      atomic_add32((atomic32_t *)(in_RDI + 0x2b8),(ulong)local_4c);
      semaphore::release((semaphore *)in_stack_ffffffffffffff90,
                         CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    }
  }
  return local_1;
}

Assistant:

inline bool task_pool::queue_multiple_object_tasks(S* pObject, T pObject_method, uint64 first_data, uint num_tasks, void* pData_ptr)
   {
      LZHAM_ASSERT(m_num_threads);
      LZHAM_ASSERT(pObject);
      LZHAM_ASSERT(num_tasks);
      if (!num_tasks)
         return true;

      bool status = true;

      uint i;
      for (i = 0; i < num_tasks; i++)
      {
         task tsk;

         tsk.m_pObj = lzham_new< object_task<S> >(pObject, pObject_method, cObjectTaskFlagDeleteAfterExecution);
         if (!tsk.m_pObj)
         {
            status = false;
            break;
         }

         tsk.m_data = first_data + i;
         tsk.m_pData_ptr = pData_ptr;
         tsk.m_flags = cTaskFlagObject;

         if (!m_task_stack.try_push(tsk))
         {
            status = false;
            break;
         }
      }

      if (i)
      {
         atomic_add32(&m_num_outstanding_tasks, i);

         m_tasks_available.release(i);
      }

      return status;
   }